

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_bound.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,ValuedAction *va)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,va->action);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(va->value);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const ValuedAction& va) {
	os << "(" << va.action << ", " << va.value << ")";
	return os;
}